

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decompressSequencesSplitLitBuffer
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  BYTE *prefixStart;
  undefined8 uVar6;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  bool bVar7;
  uint uVar8;
  BIT_DStream_status BVar9;
  long lVar10;
  size_t *psVar11;
  BYTE *pBVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  int iVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  uint uVar24;
  BYTE *pBVar25;
  ulong uVar26;
  BYTE *pBVar27;
  bool bVar28;
  BYTE *litPtr;
  BYTE *local_110;
  BIT_DStream_t local_108;
  ZSTD_fseState local_e0;
  ZSTD_fseState local_d0;
  ZSTD_fseState local_c0;
  size_t local_b0 [3];
  ulong uStack_98;
  BYTE *local_90;
  size_t local_88;
  BYTE *local_80;
  ulong local_78;
  ulong uStack_70;
  size_t local_68;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  ulong local_48;
  ulong local_40;
  uint local_34;
  
  local_80 = (BYTE *)(maxDstSize + (long)dst);
  local_110 = dctx->litPtr;
  local_60 = dctx->litBufferEnd;
  pBVar12 = (BYTE *)dst;
  if (nbSeq == 0) goto LAB_0022d37c;
  prefixStart = (BYTE *)dctx->prefixStart;
  local_50 = (BYTE *)dctx->virtualStart;
  local_58 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar10 = -0xc;
  do {
    *(ulong *)((long)&uStack_98 + lVar10 * 2) =
         (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar10);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0);
  if (seqSize == 0) {
    local_108.ptr = (char *)0x0;
    local_108.start = (char *)0x0;
    local_108.bitContainer = 0;
    local_108.bitsConsumed = 0;
    local_108._12_4_ = 0;
    local_108.limitPtr = (char *)0x0;
LAB_0022bc79:
    local_88 = 0xffffffffffffffec;
    bVar28 = false;
  }
  else {
    local_108.limitPtr = (char *)((long)seqStart + 8);
    local_108.start = (char *)seqStart;
    if (seqSize < 8) {
      local_108.bitContainer = (size_t)*seqStart;
      switch(seqSize) {
      case 7:
        local_108.bitContainer =
             (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_108.bitContainer;
      case 6:
        local_108.bitContainer =
             local_108.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_108.bitContainer =
             local_108.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_108.bitContainer =
             local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_108.bitContainer =
             local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_108.bitContainer =
             local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
      }
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar24 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      local_108.bitsConsumed = ~uVar24 + 9;
      if (bVar1 == 0) {
        local_108.bitsConsumed = 0;
      }
      local_108.ptr = (char *)seqStart;
      if (bVar1 == 0) goto LAB_0022bc79;
      local_108.bitsConsumed = local_108.bitsConsumed + (int)seqSize * -8 + 0x40;
    }
    else {
      local_108.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_108.bitContainer = *(size_t *)local_108.ptr;
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar24 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      local_108.bitsConsumed = ~uVar24 + 9;
      if (bVar1 == 0) {
        local_108.bitsConsumed = 0;
      }
      if (bVar1 == 0 || 0xffffffffffffff88 < seqSize) goto LAB_0022bc79;
    }
    ZSTD_initFseState(&local_e0,&local_108,dctx->LLTptr);
    ZSTD_initFseState(&local_d0,&local_108,dctx->OFTptr);
    ZSTD_initFseState(&local_c0,&local_108,dctx->MLTptr);
    sVar20 = local_b0[1];
    if (dst == (void *)0x0) {
      __assert_fail("dst != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x565,
                    "size_t ZSTD_decompressSequences_bodySplitLitBuffer(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                   );
    }
    bVar1 = local_e0.table[local_e0.state].nbAdditionalBits;
    if (0x10 < bVar1) {
LAB_0022d728:
      __assert_fail("llBits <= MaxLLBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x4c8,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
    }
    bVar14 = local_c0.table[local_c0.state].nbAdditionalBits;
    if (0x10 < bVar14) {
LAB_0022d709:
      __assert_fail("mlBits <= MaxMLBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x4c9,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
    }
    local_90 = (BYTE *)dst;
    bVar2 = local_d0.table[local_d0.state].nbAdditionalBits;
    if (0x1f < bVar2) {
LAB_0022d747:
      __assert_fail("ofBits <= MaxOff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x4ca,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
    }
    uVar22 = (ulong)local_c0.table[local_c0.state].baseValue;
    uVar24 = local_e0.table[local_e0.state].baseValue;
    uVar21 = (ulong)uVar24;
    uVar5 = local_e0.table[local_e0.state].nextState;
    bVar3 = local_e0.table[local_e0.state].nbBits;
    bVar4 = local_c0.table[local_c0.state].nbBits;
    bVar15 = local_d0.table[local_d0.state].nbBits;
    local_48 = (ulong)local_d0.table[local_d0.state].nextState;
    local_40 = (ulong)local_c0.table[local_c0.state].nextState;
    if (bVar2 < 2) {
      if (bVar2 != 0) {
        uVar8 = local_108.bitsConsumed + 1;
        lVar10 = (ulong)(local_d0.table[local_d0.state].baseValue + (uint)(uVar24 == 0)) -
                 ((long)(local_108.bitContainer << ((byte)local_108.bitsConsumed & 0x3f)) >> 0x3f);
        if (lVar10 == 3) {
          sVar23 = local_b0[0] - 1;
        }
        else {
          sVar23 = local_b0[lVar10];
        }
        sVar23 = sVar23 + (sVar23 == 0);
        if (lVar10 != 1) {
          local_b0[2] = local_b0[1];
        }
        local_b0[1] = local_b0[0];
        goto LAB_0022be68;
      }
      sVar23 = local_b0[uVar24 == 0];
      local_b0[1] = local_b0[uVar24 != 0];
    }
    else {
      uVar8 = local_108.bitsConsumed + bVar2;
      sVar23 = ((local_108.bitContainer << ((byte)local_108.bitsConsumed & 0x3f)) >> (-bVar2 & 0x3f)
               ) + (ulong)local_d0.table[local_d0.state].baseValue;
      local_b0[1] = local_b0[0];
      local_b0[2] = sVar20;
LAB_0022be68:
      local_b0[1] = local_b0[0];
      local_108.bitsConsumed = uVar8;
    }
    local_b0[0] = sVar23;
    if (bVar14 != 0) {
      bVar13 = (byte)local_108.bitsConsumed;
      local_108.bitsConsumed = local_108.bitsConsumed + bVar14;
      uVar22 = uVar22 + ((local_108.bitContainer << (bVar13 & 0x3f)) >> (-bVar14 & 0x3f));
    }
    if (0x1e < (byte)(bVar14 + bVar1 + bVar2)) {
      ZSTD_decompressSequencesSplitLitBuffer_cold_1();
    }
    if (bVar1 != 0) {
      bVar14 = (byte)local_108.bitsConsumed;
      local_108.bitsConsumed = local_108.bitsConsumed + bVar1;
      uVar21 = uVar21 + ((local_108.bitContainer << (bVar14 & 0x3f)) >> (-bVar1 & 0x3f));
    }
    if (0x1f < bVar3) {
LAB_0022d69b:
      __assert_fail("nbBits < BIT_MASK_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                    ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
    }
    uVar24 = bVar3 + local_108.bitsConsumed;
    local_e0.state =
         (~(-1L << (bVar3 & 0x3f)) & local_108.bitContainer >> (-(char)uVar24 & 0x3fU)) +
         (ulong)uVar5;
    local_108.bitsConsumed = uVar24;
    if (0x1f < bVar4) goto LAB_0022d69b;
    local_108.bitsConsumed = uVar24 + bVar4;
    local_c0.state =
         (~(-1L << (bVar4 & 0x3f)) &
         local_108.bitContainer >> (-(char)local_108.bitsConsumed & 0x3fU)) + local_40;
    if (0x1f < bVar15) goto LAB_0022d69b;
    local_d0.state =
         (~(-1L << (bVar15 & 0x3f)) &
         local_108.bitContainer >> (-(char)(local_108.bitsConsumed + bVar15) & 0x3fU)) + local_48;
    local_108.bitsConsumed = local_108.bitsConsumed + bVar15;
    dst = local_90;
    do {
      pBVar12 = local_110 + uVar21;
      if (dctx->litBufferEnd < pBVar12) goto LAB_0022c804;
      pBVar17 = pBVar12 + -0x20;
      local_78 = uVar21;
      uStack_70 = uVar22;
      local_68 = sVar23;
      if (local_80 <= pBVar17) {
        __assert_fail("oend_w < oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x432,
                      "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      if (local_60 < pBVar12) {
LAB_0022c50e:
        sequence.matchLength = uVar22;
        sequence.litLength = uVar21;
        sequence.offset = sVar23;
        uVar26 = ZSTD_execSequenceEndSplitLitBuffer
                           ((BYTE *)dst,local_80,pBVar17,sequence,&local_110,local_60,prefixStart,
                            local_50,local_58);
      }
      else {
        uVar26 = uVar21 + uVar22;
        pBVar18 = (BYTE *)((long)dst + uVar26);
        if (pBVar17 < pBVar18) goto LAB_0022c50e;
        if ((long)uVar21 < 0) {
          __assert_fail("op <= oLitEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x43f,
                        "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if ((long)uVar26 <= (long)uVar21) {
          __assert_fail("oLitEnd < oMatchEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x440,
                        "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (local_80 < pBVar18) {
          __assert_fail("oMatchEnd <= oend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x441,
                        "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        pBVar25 = (BYTE *)((long)dst + uVar21);
        if (pBVar17 < pBVar25) {
          __assert_fail("oLitEnd <= oend_w",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x443,
                        "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        uVar6 = *(undefined8 *)(local_110 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_110;
        *(undefined8 *)((long)dst + 8) = uVar6;
        if (0x10 < uVar21) {
          ZSTD_decompressSequencesSplitLitBuffer_cold_2();
        }
        pBVar17 = pBVar25 + -sVar23;
        local_110 = pBVar12;
        if ((ulong)((long)pBVar25 - (long)prefixStart) < local_68) {
          if ((ulong)((long)pBVar25 - (long)local_50) < local_68) {
            uVar26 = 0xffffffffffffffec;
          }
          else {
            lVar10 = (long)(pBVar25 + -sVar23) - (long)prefixStart;
            pBVar12 = local_58 + lVar10;
            if (local_58 < pBVar12 + uStack_70) {
              memmove(pBVar25,pBVar12,-lVar10);
              pBVar25 = pBVar25 + -lVar10;
              uStack_70 = uStack_70 + lVar10;
              pBVar17 = prefixStart;
              goto LAB_0022c15d;
            }
            memmove(pBVar25,pBVar12,uStack_70);
          }
        }
        else {
LAB_0022c15d:
          if (pBVar18 < pBVar25) {
            __assert_fail("op <= oMatchEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x463,
                          "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (pBVar17 < prefixStart) {
            __assert_fail("match >= prefixStart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x465,
                          "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (uStack_70 == 0) {
            __assert_fail("sequence.matchLength >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x466,
                          "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_68 < 0x10) {
            if (pBVar25 < pBVar17) goto LAB_0022d994;
            if (local_68 < 8) {
              iVar16 = *(int *)(ZSTD_overlapCopy8_dec64table + local_68 * 4);
              *pBVar25 = *pBVar17;
              pBVar25[1] = pBVar17[1];
              pBVar25[2] = pBVar17[2];
              pBVar25[3] = pBVar17[3];
              pBVar12 = pBVar17 + *(uint *)(ZSTD_overlapCopy8_dec32table + local_68 * 4);
              pBVar17 = pBVar17 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + local_68 * 4) -
                                  (long)iVar16);
              *(undefined4 *)(pBVar25 + 4) = *(undefined4 *)pBVar12;
            }
            else {
              *(undefined8 *)pBVar25 = *(undefined8 *)pBVar17;
            }
            pBVar27 = pBVar17 + 8;
            pBVar12 = pBVar25 + 8;
            lVar10 = (long)pBVar12 - (long)pBVar27;
            if (lVar10 < 8) goto LAB_0022d9b3;
            if (8 < uStack_70) {
              if (pBVar18 <= pBVar12) {
                __assert_fail("op < oMatchEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x47a,
                              "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (lVar10 < 0x10) {
                do {
                  *(undefined8 *)pBVar12 = *(undefined8 *)pBVar27;
                  pBVar12 = pBVar12 + 8;
                  pBVar27 = pBVar27 + 8;
                } while (pBVar12 < pBVar25 + uStack_70);
              }
              else {
                if (0xffffffffffffffe0 < lVar10 - 0x10U) goto LAB_0022d766;
                uVar6 = *(undefined8 *)(pBVar17 + 0x10);
                *(undefined8 *)pBVar12 = *(undefined8 *)pBVar27;
                *(undefined8 *)(pBVar25 + 0x10) = uVar6;
                if (0x18 < (long)uStack_70) {
                  lVar10 = 0;
                  do {
                    uVar6 = *(undefined8 *)(pBVar17 + lVar10 + 0x18 + 8);
                    pBVar12 = pBVar25 + lVar10 + 0x18;
                    *(undefined8 *)pBVar12 = *(undefined8 *)(pBVar17 + lVar10 + 0x18);
                    *(undefined8 *)(pBVar12 + 8) = uVar6;
                    uVar6 = *(undefined8 *)(pBVar17 + lVar10 + 0x28 + 8);
                    *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(pBVar17 + lVar10 + 0x28);
                    *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                    lVar10 = lVar10 + 0x20;
                  } while (pBVar12 + 0x20 < pBVar25 + uStack_70);
                }
              }
            }
          }
          else {
            if ((BYTE *)0xffffffffffffffe0 < pBVar25 + (-0x10 - (long)pBVar17)) goto LAB_0022d766;
            uVar6 = *(undefined8 *)(pBVar17 + 8);
            *(undefined8 *)pBVar25 = *(undefined8 *)pBVar17;
            *(undefined8 *)(pBVar25 + 8) = uVar6;
            if (0x10 < (long)uStack_70) {
              lVar10 = 0x10;
              do {
                uVar6 = *(undefined8 *)(pBVar17 + lVar10 + 8);
                pBVar12 = pBVar25 + lVar10;
                *(undefined8 *)pBVar12 = *(undefined8 *)(pBVar17 + lVar10);
                *(undefined8 *)(pBVar12 + 8) = uVar6;
                uVar6 = *(undefined8 *)(pBVar17 + lVar10 + 0x10 + 8);
                *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(pBVar17 + lVar10 + 0x10);
                *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                lVar10 = lVar10 + 0x20;
              } while (pBVar12 + 0x20 < pBVar25 + uStack_70);
            }
          }
        }
      }
      if (uVar26 < 0xffffffffffffff89) {
        dst = (void *)((long)dst + uVar26);
        nbSeq = nbSeq + -1;
        if (nbSeq == 0) {
          iVar16 = 5;
          goto LAB_0022c59b;
        }
        if (local_108.bitsConsumed < 0x41) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr == local_108.start) goto LAB_0022c286;
            uVar24 = (int)local_108.ptr - (int)local_108.start;
            if (local_108.start <=
                (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
              uVar24 = local_108.bitsConsumed >> 3;
            }
            uVar8 = local_108.bitsConsumed + uVar24 * -8;
          }
          else {
            uVar24 = local_108.bitsConsumed >> 3;
            uVar8 = local_108.bitsConsumed & 7;
          }
          local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar24);
          local_108.bitsConsumed = uVar8;
          local_108.bitContainer = *(size_t *)local_108.ptr;
        }
LAB_0022c286:
        bVar1 = local_e0.table[local_e0.state].nbAdditionalBits;
        if (0x10 < bVar1) goto LAB_0022d728;
        bVar14 = local_c0.table[local_c0.state].nbAdditionalBits;
        if (0x10 < bVar14) goto LAB_0022d709;
        bVar2 = local_d0.table[local_d0.state].nbAdditionalBits;
        if (0x1f < bVar2) goto LAB_0022d747;
        uVar22 = (ulong)local_c0.table[local_c0.state].baseValue;
        uVar24 = local_e0.table[local_e0.state].baseValue;
        uVar21 = (ulong)uVar24;
        uVar5 = local_e0.table[local_e0.state].nextState;
        local_40 = (ulong)local_c0.table[local_c0.state].nextState;
        local_48 = (ulong)local_d0.table[local_d0.state].nextState;
        bVar3 = local_e0.table[local_e0.state].nbBits;
        bVar4 = local_c0.table[local_c0.state].nbBits;
        bVar15 = local_d0.table[local_d0.state].nbBits;
        bVar13 = (byte)local_108.bitsConsumed;
        if (bVar2 < 2) {
          if (bVar2 == 0) {
            sVar23 = local_b0[uVar24 == 0];
            psVar11 = local_b0 + (uVar24 != 0);
          }
          else {
            local_108.bitsConsumed = local_108.bitsConsumed + 1;
            lVar10 = (ulong)(local_d0.table[local_d0.state].baseValue + (uint)(uVar24 == 0)) -
                     ((long)(local_108.bitContainer << (bVar13 & 0x3f)) >> 0x3f);
            if (lVar10 == 3) {
              local_b0[0] = local_b0[0] - 1;
            }
            else {
              local_b0[0] = local_b0[lVar10];
            }
            sVar23 = local_b0[0] + (local_b0[0] == 0);
            if (lVar10 != 1) {
              local_b0[2] = local_b0[1];
            }
            psVar11 = local_b0;
          }
        }
        else {
          local_108.bitsConsumed = local_108.bitsConsumed + bVar2;
          sVar23 = ((local_108.bitContainer << (bVar13 & 0x3f)) >> (-bVar2 & 0x3f)) +
                   (ulong)local_d0.table[local_d0.state].baseValue;
          local_b0[2] = local_b0[1];
          psVar11 = local_b0;
        }
        local_b0[1] = *psVar11;
        local_b0[0] = sVar23;
        if (bVar14 != 0) {
          bVar13 = (byte)local_108.bitsConsumed;
          local_108.bitsConsumed = local_108.bitsConsumed + bVar14;
          uVar22 = uVar22 + ((local_108.bitContainer << (bVar13 & 0x3f)) >> (-bVar14 & 0x3f));
        }
        if ((0x1e < (byte)(bVar14 + bVar1 + bVar2)) && (local_108.bitsConsumed < 0x41)) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr != local_108.start) {
              uVar24 = (int)local_108.ptr - (int)local_108.start;
              if (local_108.start <=
                  (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
                uVar24 = local_108.bitsConsumed >> 3;
              }
              local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar24);
              local_108.bitsConsumed = local_108.bitsConsumed + uVar24 * -8;
              local_108.bitContainer = *(size_t *)local_108.ptr;
            }
          }
          else {
            BIT_reloadDStreamFast(&local_108);
          }
        }
        if (bVar1 != 0) {
          bVar14 = (byte)local_108.bitsConsumed;
          local_108.bitsConsumed = local_108.bitsConsumed + bVar1;
          uVar21 = uVar21 + ((local_108.bitContainer << (bVar14 & 0x3f)) >> (-bVar1 & 0x3f));
        }
        if (0x1f < bVar3) goto LAB_0022d69b;
        uVar24 = bVar3 + local_108.bitsConsumed;
        local_e0.state =
             (~(-1L << (bVar3 & 0x3f)) & local_108.bitContainer >> (-(char)uVar24 & 0x3fU)) +
             (ulong)uVar5;
        local_108.bitsConsumed = uVar24;
        if (0x1f < bVar4) goto LAB_0022d69b;
        local_108.bitsConsumed = uVar24 + bVar4;
        local_c0.state =
             (~(-1L << (bVar4 & 0x3f)) &
             local_108.bitContainer >> (-(char)local_108.bitsConsumed & 0x3fU)) + local_40;
        if (0x1f < bVar15) goto LAB_0022d69b;
        local_d0.state =
             (~(-1L << (bVar15 & 0x3f)) &
             local_108.bitContainer >> (-(char)(local_108.bitsConsumed + bVar15) & 0x3fU)) +
             local_48;
        local_108.bitsConsumed = local_108.bitsConsumed + bVar15;
        iVar16 = 0;
        bVar28 = true;
      }
      else {
        iVar16 = 1;
        local_88 = uVar26;
LAB_0022c59b:
        bVar28 = false;
      }
    } while (iVar16 == 0);
    if (iVar16 == 5) {
LAB_0022c804:
      bVar7 = true;
      bVar28 = bVar7;
      if (0 < nbSeq) {
        uVar26 = (long)dctx->litBufferEnd - (long)local_110;
        if (uVar26 != 0) {
          if ((ulong)((long)local_80 - (long)dst) < uVar26) {
            local_88 = 0xffffffffffffffba;
            bVar28 = false;
            goto LAB_0022cb02;
          }
          ZSTD_safecopyDstBeforeSrc((BYTE *)dst,local_110,uVar26);
          uVar21 = uVar21 - uVar26;
          dst = (void *)((long)dst + uVar26);
        }
        local_110 = dctx->litExtraBuffer;
        dctx->litBufferLocation = ZSTD_not_in_dst;
        local_78 = uVar21;
        uStack_70 = uVar22;
        local_68 = sVar23;
        if ((BYTE *)dst == (BYTE *)0x0) {
LAB_0022d87d:
          __assert_fail("op != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x3d0,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        local_60 = dctx->litExtraBuffer + 0x10000;
        if ((long)uVar21 < 0x10001) {
          sVar20 = uVar22 + uVar21;
          pBVar12 = (BYTE *)((long)dst + sVar20);
          if (local_80 + -0x20 < pBVar12) goto LAB_0022d4ca;
          if ((long)uVar21 < 0) {
LAB_0022d8f9:
            __assert_fail("op <= oLitEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x3e3,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if ((long)sVar20 <= (long)uVar21) {
LAB_0022d8bb:
            __assert_fail("oLitEnd < oMatchEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x3e4,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_80 < pBVar12) {
LAB_0022d89c:
            __assert_fail("oMatchEnd <= oend",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x3e5,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          pBVar17 = (BYTE *)((long)dst + uVar21);
          if (local_80 + -0x20 < pBVar17) {
LAB_0022d8da:
            __assert_fail("oLitEnd <= oend_w",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,999,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          pBVar18 = dctx->litExtraBuffer + uVar21;
          uVar6 = *(undefined8 *)(dctx->litExtraBuffer + 8);
          *(undefined8 *)dst = *(undefined8 *)local_110;
          *(undefined8 *)((long)dst + 8) = uVar6;
          if (0x10 < uVar21) {
            ZSTD_decompressSequencesSplitLitBuffer_cold_3();
          }
          pBVar25 = pBVar17 + -sVar23;
          local_110 = pBVar18;
          if ((ulong)((long)pBVar17 - (long)prefixStart) < local_68) {
            if ((ulong)((long)pBVar17 - (long)local_50) < local_68) {
              sVar20 = 0xffffffffffffffec;
            }
            else {
              lVar10 = (long)(pBVar17 + -sVar23) - (long)prefixStart;
              pBVar18 = local_58 + lVar10;
              if (local_58 < pBVar18 + uStack_70) {
                memmove(pBVar17,pBVar18,-lVar10);
                pBVar17 = pBVar17 + -lVar10;
                uStack_70 = uStack_70 + lVar10;
                pBVar25 = prefixStart;
                goto LAB_0022c9e6;
              }
              memmove(pBVar17,pBVar18,uStack_70);
            }
          }
          else {
LAB_0022c9e6:
            if (pBVar12 < pBVar17) {
LAB_0022d918:
              __assert_fail("op <= oMatchEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x408,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (pBVar25 < prefixStart) {
LAB_0022d956:
              __assert_fail("match >= prefixStart",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x40a,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (uStack_70 == 0) {
LAB_0022d937:
              __assert_fail("sequence.matchLength >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x40b,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (local_68 < 0x10) {
              if (pBVar17 < pBVar25) {
LAB_0022d994:
                __assert_fail("*ip <= *op",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x303,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if (local_68 < 8) {
                iVar16 = *(int *)(ZSTD_overlapCopy8_dec64table + local_68 * 4);
                *pBVar17 = *pBVar25;
                pBVar17[1] = pBVar25[1];
                pBVar17[2] = pBVar25[2];
                pBVar17[3] = pBVar25[3];
                pBVar18 = pBVar25 + *(uint *)(ZSTD_overlapCopy8_dec32table + local_68 * 4);
                pBVar25 = pBVar25 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + local_68 * 4) -
                                    (long)iVar16);
                *(undefined4 *)(pBVar17 + 4) = *(undefined4 *)pBVar18;
              }
              else {
                *(undefined8 *)pBVar17 = *(undefined8 *)pBVar25;
              }
              pBVar18 = pBVar25 + 8;
              pBVar27 = pBVar17 + 8;
              lVar10 = (long)pBVar27 - (long)pBVar18;
              if (lVar10 < 8) {
LAB_0022d9b3:
                __assert_fail("*op - *ip >= 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x315,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if (8 < uStack_70) {
                if (pBVar12 <= pBVar27) {
LAB_0022d9f1:
                  __assert_fail("op < oMatchEnd",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                ,0x41f,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if (lVar10 < 0x10) {
                  do {
                    *(undefined8 *)pBVar27 = *(undefined8 *)pBVar18;
                    pBVar27 = pBVar27 + 8;
                    pBVar18 = pBVar18 + 8;
                  } while (pBVar27 < pBVar17 + uStack_70);
                }
                else {
                  if (0xffffffffffffffe0 < lVar10 - 0x10U) goto LAB_0022d766;
                  uVar6 = *(undefined8 *)(pBVar25 + 0x10);
                  *(undefined8 *)pBVar27 = *(undefined8 *)pBVar18;
                  *(undefined8 *)(pBVar17 + 0x10) = uVar6;
                  if (0x18 < (long)uStack_70) {
                    lVar10 = 0;
                    do {
                      uVar6 = *(undefined8 *)(pBVar25 + lVar10 + 0x18 + 8);
                      pBVar12 = pBVar17 + lVar10 + 0x18;
                      *(undefined8 *)pBVar12 = *(undefined8 *)(pBVar25 + lVar10 + 0x18);
                      *(undefined8 *)(pBVar12 + 8) = uVar6;
                      uVar6 = *(undefined8 *)(pBVar25 + lVar10 + 0x28 + 8);
                      *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(pBVar25 + lVar10 + 0x28);
                      *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                      lVar10 = lVar10 + 0x20;
                    } while (pBVar12 + 0x20 < pBVar17 + uStack_70);
                  }
                }
              }
            }
            else {
              if ((BYTE *)0xffffffffffffffe0 < pBVar17 + (-0x10 - (long)pBVar25)) {
LAB_0022d766:
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/zstd_internal.h"
                              ,0xe9,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              uVar6 = *(undefined8 *)(pBVar25 + 8);
              *(undefined8 *)pBVar17 = *(undefined8 *)pBVar25;
              *(undefined8 *)(pBVar17 + 8) = uVar6;
              if (0x10 < (long)uStack_70) {
                lVar10 = 0x10;
                do {
                  uVar6 = *(undefined8 *)(pBVar25 + lVar10 + 8);
                  pBVar12 = pBVar17 + lVar10;
                  *(undefined8 *)pBVar12 = *(undefined8 *)(pBVar25 + lVar10);
                  *(undefined8 *)(pBVar12 + 8) = uVar6;
                  uVar6 = *(undefined8 *)(pBVar25 + lVar10 + 0x10 + 8);
                  *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(pBVar25 + lVar10 + 0x10);
                  *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                  lVar10 = lVar10 + 0x20;
                } while (pBVar12 + 0x20 < pBVar17 + uStack_70);
              }
            }
          }
        }
        else {
LAB_0022d4ca:
          sequence_01.matchLength = uVar22;
          sequence_01.litLength = uVar21;
          sequence_01.offset = sVar23;
          sVar20 = ZSTD_execSequenceEnd
                             ((BYTE *)dst,local_80,sequence_01,&local_110,
                              dctx->litExtraBuffer + 0x10000,prefixStart,local_50,local_58);
        }
        bVar28 = sVar20 < 0xffffffffffffff89;
        if (bVar28) {
          dst = (void *)((long)dst + sVar20);
          nbSeq = nbSeq + -1;
          bVar28 = bVar7;
          if ((nbSeq != 0) && (local_108.bitsConsumed < 0x41)) {
            if (local_108.ptr < local_108.limitPtr) {
              if (local_108.ptr != local_108.start) {
                uVar24 = (int)local_108.ptr - (int)local_108.start;
                if (local_108.start <=
                    (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
                  uVar24 = local_108.bitsConsumed >> 3;
                }
                local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar24);
                local_108.bitsConsumed = local_108.bitsConsumed + uVar24 * -8;
                local_108.bitContainer = *(size_t *)local_108.ptr;
              }
            }
            else {
              BIT_reloadDStreamFast(&local_108);
            }
          }
        }
        else {
          local_88 = sVar20;
        }
      }
    }
LAB_0022cb02:
    if (bVar28) {
      if (0 < nbSeq) {
        pBVar12 = local_80 + -0x20;
        do {
          bVar1 = local_e0.table[local_e0.state].nbAdditionalBits;
          if (0x10 < bVar1) goto LAB_0022d728;
          bVar14 = local_c0.table[local_c0.state].nbAdditionalBits;
          if (0x10 < bVar14) goto LAB_0022d709;
          bVar2 = local_d0.table[local_d0.state].nbAdditionalBits;
          if (0x1f < bVar2) goto LAB_0022d747;
          uVar21 = (ulong)local_c0.table[local_c0.state].baseValue;
          uVar24 = local_e0.table[local_e0.state].baseValue;
          uVar22 = (ulong)uVar24;
          local_40 = (ulong)local_e0.table[local_e0.state].nextState;
          local_48 = (ulong)local_c0.table[local_c0.state].nextState;
          uVar5 = local_d0.table[local_d0.state].nextState;
          bVar3 = local_e0.table[local_e0.state].nbBits;
          bVar4 = local_c0.table[local_c0.state].nbBits;
          uVar8 = (uint)local_d0.table[local_d0.state].nbBits;
          bVar15 = (byte)local_108.bitsConsumed;
          if (bVar2 < 2) {
            if (bVar2 == 0) {
              sVar20 = local_b0[uVar24 == 0];
              psVar11 = local_b0 + (uVar24 != 0);
            }
            else {
              local_108.bitsConsumed = local_108.bitsConsumed + 1;
              lVar10 = (ulong)(local_d0.table[local_d0.state].baseValue + (uint)(uVar24 == 0)) -
                       ((long)(local_108.bitContainer << (bVar15 & 0x3f)) >> 0x3f);
              if (lVar10 == 3) {
                local_b0[0] = local_b0[0] - 1;
              }
              else {
                local_b0[0] = local_b0[lVar10];
              }
              sVar20 = local_b0[0] + (local_b0[0] == 0);
              if (lVar10 != 1) {
                local_b0[2] = local_b0[1];
              }
              psVar11 = local_b0;
            }
          }
          else {
            local_108.bitsConsumed = local_108.bitsConsumed + bVar2;
            sVar20 = ((local_108.bitContainer << (bVar15 & 0x3f)) >> (-bVar2 & 0x3f)) +
                     (ulong)local_d0.table[local_d0.state].baseValue;
            local_b0[2] = local_b0[1];
            psVar11 = local_b0;
          }
          local_b0[1] = *psVar11;
          local_b0[0] = sVar20;
          if (bVar14 != 0) {
            bVar15 = (byte)local_108.bitsConsumed;
            local_108.bitsConsumed = local_108.bitsConsumed + bVar14;
            uVar21 = uVar21 + ((local_108.bitContainer << (bVar15 & 0x3f)) >> (-bVar14 & 0x3f));
          }
          if ((0x1e < (byte)(bVar14 + bVar1 + bVar2)) && (local_108.bitsConsumed < 0x41)) {
            if (local_108.ptr < local_108.limitPtr) {
              if (local_108.ptr != local_108.start) {
                uVar24 = (int)local_108.ptr - (int)local_108.start;
                if (local_108.start <=
                    (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
                  uVar24 = local_108.bitsConsumed >> 3;
                }
                local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar24);
                local_108.bitsConsumed = local_108.bitsConsumed + uVar24 * -8;
                local_108.bitContainer = *(size_t *)local_108.ptr;
              }
            }
            else {
              local_34 = uVar8;
              BIT_reloadDStreamFast(&local_108);
              uVar8 = local_34;
            }
          }
          if (bVar1 != 0) {
            bVar14 = (byte)local_108.bitsConsumed;
            local_108.bitsConsumed = local_108.bitsConsumed + bVar1;
            uVar22 = uVar22 + ((local_108.bitContainer << (bVar14 & 0x3f)) >> (-bVar1 & 0x3f));
          }
          if (0x1f < bVar3) goto LAB_0022d69b;
          uVar24 = bVar3 + local_108.bitsConsumed;
          local_e0.state =
               (~(-1L << (bVar3 & 0x3f)) & local_108.bitContainer >> (-(char)uVar24 & 0x3fU)) +
               local_40;
          local_108.bitsConsumed = uVar24;
          if (0x1f < bVar4) goto LAB_0022d69b;
          local_108.bitsConsumed = uVar24 + bVar4;
          local_c0.state =
               (~(-1L << (bVar4 & 0x3f)) &
               local_108.bitContainer >> (-(char)local_108.bitsConsumed & 0x3fU)) + local_48;
          if (0x1f < (byte)uVar8) goto LAB_0022d69b;
          local_d0.state =
               (~(-1L << ((byte)uVar8 & 0x3f)) &
               local_108.bitContainer >> (-(char)(local_108.bitsConsumed + uVar8) & 0x3fU)) +
               (ulong)uVar5;
          local_108.bitsConsumed = local_108.bitsConsumed + uVar8;
          local_78 = uVar22;
          uStack_70 = uVar21;
          local_68 = sVar20;
          if ((BYTE *)dst == (BYTE *)0x0) goto LAB_0022d87d;
          pBVar17 = local_110 + uVar22;
          if (local_60 < pBVar17) {
LAB_0022d010:
            sequence_00.matchLength = uVar21;
            sequence_00.litLength = uVar22;
            sequence_00.offset = sVar20;
            sVar23 = ZSTD_execSequenceEnd
                               ((BYTE *)dst,local_80,sequence_00,&local_110,local_60,prefixStart,
                                local_50,local_58);
          }
          else {
            sVar23 = uVar21 + uVar22;
            pBVar18 = (BYTE *)((long)dst + sVar23);
            if (pBVar12 < pBVar18) goto LAB_0022d010;
            if ((long)uVar22 < 0) goto LAB_0022d8f9;
            if ((long)sVar23 <= (long)uVar22) goto LAB_0022d8bb;
            if (local_80 < pBVar18) goto LAB_0022d89c;
            pBVar25 = (BYTE *)((long)dst + uVar22);
            if (pBVar12 < pBVar25) goto LAB_0022d8da;
            uVar6 = *(undefined8 *)(local_110 + 8);
            *(undefined8 *)dst = *(undefined8 *)local_110;
            *(undefined8 *)((long)dst + 8) = uVar6;
            if (0x10 < uVar22) {
              ZSTD_decompressSequencesSplitLitBuffer_cold_4();
            }
            pBVar27 = pBVar25 + -sVar20;
            local_110 = pBVar17;
            if ((ulong)((long)pBVar25 - (long)prefixStart) < local_68) {
              if ((ulong)((long)pBVar25 - (long)local_50) < local_68) {
                sVar23 = 0xffffffffffffffec;
              }
              else {
                lVar10 = (long)pBVar27 - (long)prefixStart;
                pBVar17 = local_58 + lVar10;
                if (local_58 < pBVar17 + uStack_70) {
                  memmove(pBVar25,pBVar17,-lVar10);
                  pBVar25 = pBVar25 + -lVar10;
                  uStack_70 = uStack_70 + lVar10;
                  pBVar27 = prefixStart;
                  goto LAB_0022ced8;
                }
                memmove(pBVar25,pBVar17,uStack_70);
              }
            }
            else {
LAB_0022ced8:
              if (pBVar18 < pBVar25) goto LAB_0022d918;
              if (pBVar27 < prefixStart) goto LAB_0022d956;
              if (uStack_70 == 0) goto LAB_0022d937;
              if (local_68 < 0x10) {
                if (pBVar25 < pBVar27) goto LAB_0022d994;
                if (local_68 < 8) {
                  iVar16 = *(int *)(ZSTD_overlapCopy8_dec64table + local_68 * 4);
                  *pBVar25 = *pBVar27;
                  pBVar25[1] = pBVar27[1];
                  pBVar25[2] = pBVar27[2];
                  pBVar25[3] = pBVar27[3];
                  pBVar17 = pBVar27 + *(uint *)(ZSTD_overlapCopy8_dec32table + local_68 * 4);
                  pBVar27 = pBVar27 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + local_68 * 4)
                                      - (long)iVar16);
                  *(undefined4 *)(pBVar25 + 4) = *(undefined4 *)pBVar17;
                }
                else {
                  *(undefined8 *)pBVar25 = *(undefined8 *)pBVar27;
                }
                pBVar17 = pBVar27 + 8;
                pBVar19 = pBVar25 + 8;
                lVar10 = (long)pBVar19 - (long)pBVar17;
                if (lVar10 < 8) goto LAB_0022d9b3;
                if (8 < uStack_70) {
                  if (pBVar18 <= pBVar19) goto LAB_0022d9f1;
                  if (lVar10 < 0x10) {
                    do {
                      *(undefined8 *)pBVar19 = *(undefined8 *)pBVar17;
                      pBVar19 = pBVar19 + 8;
                      pBVar17 = pBVar17 + 8;
                    } while (pBVar19 < pBVar25 + uStack_70);
                  }
                  else {
                    if (0xffffffffffffffe0 < lVar10 - 0x10U) goto LAB_0022d766;
                    uVar6 = *(undefined8 *)(pBVar27 + 0x10);
                    *(undefined8 *)pBVar19 = *(undefined8 *)pBVar17;
                    *(undefined8 *)(pBVar25 + 0x10) = uVar6;
                    if (0x18 < (long)uStack_70) {
                      lVar10 = 0;
                      do {
                        uVar6 = *(undefined8 *)(pBVar27 + lVar10 + 0x18 + 8);
                        pBVar17 = pBVar25 + lVar10 + 0x18;
                        *(undefined8 *)pBVar17 = *(undefined8 *)(pBVar27 + lVar10 + 0x18);
                        *(undefined8 *)(pBVar17 + 8) = uVar6;
                        uVar6 = *(undefined8 *)(pBVar27 + lVar10 + 0x28 + 8);
                        *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(pBVar27 + lVar10 + 0x28);
                        *(undefined8 *)(pBVar17 + 0x18) = uVar6;
                        lVar10 = lVar10 + 0x20;
                      } while (pBVar17 + 0x20 < pBVar25 + uStack_70);
                    }
                  }
                }
              }
              else {
                if ((BYTE *)0xffffffffffffffe0 < pBVar25 + (-0x10 - (long)pBVar27))
                goto LAB_0022d766;
                uVar6 = *(undefined8 *)(pBVar27 + 8);
                *(undefined8 *)pBVar25 = *(undefined8 *)pBVar27;
                *(undefined8 *)(pBVar25 + 8) = uVar6;
                if (0x10 < (long)uStack_70) {
                  lVar10 = 0x10;
                  do {
                    uVar6 = *(undefined8 *)(pBVar27 + lVar10 + 8);
                    pBVar17 = pBVar25 + lVar10;
                    *(undefined8 *)pBVar17 = *(undefined8 *)(pBVar27 + lVar10);
                    *(undefined8 *)(pBVar17 + 8) = uVar6;
                    uVar6 = *(undefined8 *)(pBVar27 + lVar10 + 0x10 + 8);
                    *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(pBVar27 + lVar10 + 0x10);
                    *(undefined8 *)(pBVar17 + 0x18) = uVar6;
                    lVar10 = lVar10 + 0x20;
                  } while (pBVar17 + 0x20 < pBVar25 + uStack_70);
                }
              }
            }
          }
          if (sVar23 < 0xffffffffffffff89) {
            dst = (void *)((long)dst + sVar23);
            iVar16 = 0;
            nbSeq = nbSeq + -1;
            if (nbSeq == 0) {
              iVar16 = 7;
              bVar28 = false;
            }
            else {
              bVar28 = true;
              if (local_108.bitsConsumed < 0x41) {
                if (local_108.ptr < local_108.limitPtr) {
                  if (local_108.ptr == local_108.start) goto LAB_0022d003;
                  uVar24 = (int)local_108.ptr - (int)local_108.start;
                  if (local_108.start <=
                      (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
                    uVar24 = local_108.bitsConsumed >> 3;
                  }
                  uVar8 = local_108.bitsConsumed + uVar24 * -8;
                }
                else {
                  uVar24 = local_108.bitsConsumed >> 3;
                  uVar8 = local_108.bitsConsumed & 7;
                }
                local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar24);
                local_108.bitsConsumed = uVar8;
                local_108.bitContainer = *(size_t *)local_108.ptr;
              }
            }
          }
          else {
            iVar16 = 1;
            bVar28 = false;
            local_88 = sVar23;
          }
LAB_0022d003:
        } while (iVar16 == 0);
        pBVar12 = local_90;
        if (iVar16 != 7) goto LAB_0022d374;
      }
      pBVar12 = local_90;
      if (nbSeq == 0) {
        BVar9 = BIT_DStream_overflow;
        if (local_108.bitsConsumed < 0x41) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr == local_108.start) {
              BVar9 = (local_108.bitsConsumed == 0x40) + BIT_DStream_endOfBuffer;
            }
            else {
              bVar28 = (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3)) <
                       local_108.start;
              uVar22 = (ulong)(uint)((int)local_108.ptr - (int)local_108.start);
              if (!bVar28) {
                uVar22 = (ulong)(local_108.bitsConsumed >> 3);
              }
              BVar9 = (BIT_DStream_status)bVar28;
              local_108.ptr = (char *)((long)local_108.ptr - uVar22);
              local_108.bitsConsumed = local_108.bitsConsumed + (int)uVar22 * -8;
              local_108.bitContainer = *(size_t *)local_108.ptr;
            }
          }
          else {
            BVar9 = BIT_reloadDStreamFast(&local_108);
          }
        }
        if (BIT_DStream_endOfBuffer < BVar9) {
          lVar10 = 0;
          do {
            (dctx->entropy).rep[lVar10] = (U32)local_b0[lVar10];
            lVar10 = lVar10 + 1;
            bVar28 = true;
          } while (lVar10 != 3);
          goto LAB_0022d374;
        }
      }
      bVar28 = false;
      local_88 = 0xffffffffffffffec;
    }
    else {
      bVar28 = false;
      pBVar12 = local_90;
    }
  }
LAB_0022d374:
  if (!bVar28) {
    return local_88;
  }
LAB_0022d37c:
  if (dctx->litBufferLocation == ZSTD_split) {
    uVar21 = (long)local_60 - (long)local_110;
    uVar22 = (long)local_80 - (long)dst;
    if (uVar22 < uVar21) {
      local_88 = 0xffffffffffffffba;
    }
    else {
      if ((BYTE *)dst == (BYTE *)0x0) {
        dst = (BYTE *)0x0;
      }
      else {
        memmove(dst,local_110,uVar21);
        dst = (void *)((long)dst + uVar21);
      }
      local_110 = dctx->litExtraBuffer;
      dctx->litBufferLocation = ZSTD_not_in_dst;
      local_60 = dctx->litExtraBuffer + 0x10000;
    }
    if (uVar22 < uVar21) {
      return local_88;
    }
  }
  uVar21 = (long)local_60 - (long)local_110;
  uVar22 = (long)local_80 - (long)dst;
  if (uVar22 < uVar21) {
    local_88 = 0xffffffffffffffba;
  }
  else if ((BYTE *)dst == (BYTE *)0x0) {
    dst = (BYTE *)0x0;
  }
  else {
    memcpy(dst,local_110,uVar21);
    dst = (void *)((long)dst + uVar21);
  }
  if (uVar21 <= uVar22) {
    local_88 = (long)dst - (long)pBVar12;
  }
  return local_88;
}

Assistant:

static size_t
ZSTD_decompressSequencesSplitLitBuffer(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                                 const void* seqStart, size_t seqSize, int nbSeq,
                                 const ZSTD_longOffset_e isLongOffset,
                                 const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesSplitLitBuffer");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesSplitLitBuffer_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
    return ZSTD_decompressSequencesSplitLitBuffer_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}